

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O2

Nonnull<const_char_*> __thiscall
absl::lts_20250127::BadStatusOrAccess::what(BadStatusOrAccess *this)

{
  InitWhat(this);
  return (this->what_)._M_dataplus._M_p;
}

Assistant:

absl::Nonnull<const char*> BadStatusOrAccess::what() const noexcept {
  InitWhat();
  return what_.c_str();
}